

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  long lVar1;
  long lVar2;
  GMM_RESOURCE_FORMAT GVar3;
  uint uVar4;
  GMM_TILE_MODE GVar5;
  Context *pCVar6;
  PlatformInfo *pPVar7;
  int iVar8;
  uint32_t uVar9;
  GMM_PLATFORM_INFO *pGVar10;
  ulong uVar11;
  byte bVar12;
  uint32_t NumSamples;
  GMM_GFX_SIZE_T *pGVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  GMM_GFX_SIZE_T *pGVar17;
  GMM_GFX_SIZE_T *pGVar18;
  GMM_GFX_SIZE_T *pGVar19;
  int iVar20;
  anon_struct_8_45_9b07292e_for_Gpu aVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  GMM_GFX_SIZE_T *local_40;
  GMM_GFX_SIZE_T *local_38;
  
  if (TILE__64_2D_16X_128bpe < pTexInfo->TileMode) {
    return;
  }
  uVar23 = pTexInfo->BitsPerPixel * (int)pTexInfo->BaseWidth;
  pGVar10 = GmmGetPlatformInfo((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                               super_GmmTextureCalc.pGmmLibContext);
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[1] = 0;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = 0;
  uVar9 = pTexInfo->BaseHeight;
  aVar21 = (pTexInfo->Flags).Gpu;
  if (((ulong)aVar21 >> 0x29 & 1) != 0) {
    if (((ulong)aVar21 & 0x20000040) == 0) {
      NumSamples = 1;
    }
    else {
      NumSamples = (pTexInfo->MSAA).NumSamples;
    }
    uVar9 = GmmTextureCalc::ExpandHeight
                      ((GmmTextureCalc *)this,uVar9,(pTexInfo->Alignment).VAlign,NumSamples);
    uVar9 = (*(this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
              _vptr_GmmTextureCalc[0x17])(this,pTexInfo,(ulong)uVar9);
    aVar21 = (pTexInfo->Flags).Gpu;
    if (((ulong)aVar21 & 0x2000000000) != 0) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
    }
  }
  pGVar19 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 2;
  pGVar17 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 6;
  local_38 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 3;
  local_40 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 7;
  GVar3 = pTexInfo->Format;
  bVar26 = false;
  switch(GVar3) {
  case GMM_FORMAT_I420:
  case GMM_FORMAT_IYUV:
    pGVar13 = local_40;
    pGVar18 = local_38;
    local_40 = pGVar17;
    local_38 = pGVar19;
    break;
  case GMM_FORMAT_IMC1:
    pGVar13 = pGVar17;
    pGVar17 = local_40;
    pGVar18 = local_38;
    local_38 = pGVar19;
    goto LAB_001b36e8;
  case GMM_FORMAT_IMC2:
    pGVar13 = pGVar17;
    pGVar17 = local_40;
    pGVar18 = local_38;
    local_38 = pGVar19;
    goto LAB_001b372b;
  case GMM_FORMAT_IMC3:
  case GMM_FORMAT_MFX_JPEG_YUV420:
  case GMM_FORMAT_MFX_JPEG_YUV422V:
    pGVar13 = local_40;
    pGVar18 = pGVar19;
LAB_001b36e8:
    *pGVar18 = 0;
    uVar9 = pTexInfo->BaseHeight;
    uVar25 = uVar9 + 0xf & 0xfffffff0;
    uVar11 = (ulong)uVar25;
    *pGVar17 = uVar11;
    *local_38 = 0;
    uVar23 = (uVar9 + 1 >> 1) + 0xf & 0xfffffff0;
    *pGVar13 = (ulong)(uVar23 + uVar25);
    local_40 = pGVar13;
    pGVar19 = pGVar18;
LAB_001b370c:
    bVar26 = false;
    uVar15 = (ulong)uVar23;
    goto LAB_001b3752;
  case GMM_FORMAT_IMC4:
    pGVar13 = local_40;
    pGVar18 = pGVar19;
LAB_001b372b:
    local_40 = pGVar13;
    *pGVar18 = 0;
    uVar23 = pTexInfo->BaseHeight + 0xf & 0xfffffff0;
    uVar11 = (ulong)uVar23;
    *pGVar17 = uVar11;
    *local_38 = pTexInfo->Pitch >> 1;
    *local_40 = uVar11;
    bVar26 = true;
    uVar15 = (ulong)(uVar23 >> 1);
    pGVar19 = pGVar18;
    goto LAB_001b3752;
  case GMM_FORMAT_L4A4:
  case GMM_FORMAT_P8:
  case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
  case GMM_FORMAT_R24G8_TYPELESS:
  case GMM_FORMAT_R32G8X24_TYPELESS:
  case GMM_FORMAT_RENDER_8BIT:
  case GMM_FORMAT_Y1_UNORM:
  case GMM_FORMAT_Y8_UNORM_VA:
  case GMM_FORMAT_Y16_SNORM:
  case GMM_FORMAT_Y16_UNORM:
  case GMM_FORMAT_Y32_UNORM:
  case GMM_FORMAT_Y210:
  case GMM_FORMAT_Y212:
  case GMM_FORMAT_Y410:
  case GMM_FORMAT_Y412:
  case GMM_FORMAT_Y216:
  case GMM_FORMAT_Y416:
  case GMM_FORMAT_UYVY_2x1:
  case GMM_FORMAT_VYUY_2x1:
  case GMM_FORMAT_YUY2_2x1:
  case GMM_FORMAT_YVYU_2x1:
  case GMM_FORMAT_MEDIA_Y1_UNORM:
  case GMM_FORMAT_MEDIA_Y8_UNORM:
  case GMM_FORMAT_MEDIA_Y16_SNORM:
  case GMM_FORMAT_MEDIA_Y16_UNORM:
  case GMM_FORMAT_MEDIA_Y32_UNORM:
  case GMM_FORMAT_B16G16R16A16_UNORM:
    goto switchD_001b353b_caseD_155;
  case GMM_FORMAT_MFX_JPEG_YUV411:
  case GMM_FORMAT_MFX_JPEG_YUV422H:
  case GMM_FORMAT_MFX_JPEG_YUV444:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    uVar23 = pTexInfo->BaseHeight + 0xf & 0xfffffff0;
    uVar11 = (ulong)uVar23;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[6] = uVar11;
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x40) = (ulong)(uVar23 * 2);
    goto LAB_001b368a;
  case GMM_FORMAT_MFX_JPEG_YUV411R:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    uVar9 = pTexInfo->BaseHeight;
    uVar25 = uVar9 + 0xf & 0xfffffff0;
    uVar11 = (ulong)uVar25;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[6] = uVar11;
    uVar23 = (uVar9 + 3 >> 2) + 0xf & 0xfffffff0;
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x40) = (ulong)(uVar23 + uVar25);
    goto LAB_001b370c;
  case GMM_FORMAT_NV11:
  case GMM_FORMAT_NV12:
  case GMM_FORMAT_NV21:
  case GMM_FORMAT_P010:
  case GMM_FORMAT_P012:
  case GMM_FORMAT_P016:
  case GMM_FORMAT_P208:
  case GMM_FORMAT_P216:
    uVar11 = (ulong)(uVar9 + 1 & 0xfffffffe);
    *pGVar19 = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    *local_40 = uVar11;
    *pGVar17 = uVar11;
    bVar26 = true;
    uVar15 = uVar11;
    if ((GVar3 - GMM_FORMAT_NV12 < 6) && (GVar3 - GMM_FORMAT_NV12 != 2)) {
      uVar15 = (ulong)(uVar9 + 1 >> 1);
    }
    goto LAB_001b3752;
  case GMM_FORMAT_RGBP:
switchD_001b353b_caseD_168:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    uVar23 = pTexInfo->BaseHeight;
    if ((*(uint *)&(pTexInfo->Flags).Info >> 0x13 & 1) == 0) {
      uVar23 = uVar23 + 0xf & 0xfffffff0;
    }
    uVar11 = (ulong)uVar23;
    *pGVar17 = uVar11;
    *local_38 = 0;
    *local_40 = uVar11 * 2;
LAB_001b368a:
    bVar26 = false;
    uVar15 = uVar11;
    goto LAB_001b3752;
  case GMM_FORMAT_YV12:
  case GMM_FORMAT_YVU9:
    pGVar13 = pGVar17;
    pGVar18 = pGVar19;
    break;
  default:
    if (GVar3 == GMM_FORMAT_BGRP) goto switchD_001b353b_caseD_168;
    goto switchD_001b353b_caseD_155;
  }
  pGVar17 = pGVar13;
  uVar11 = pTexInfo->Pitch;
  uVar4 = pTexInfo->BaseHeight;
  iVar20 = uVar4 * (int)uVar11;
  bVar26 = GVar3 == GMM_FORMAT_YVU9;
  uVar25 = (uint)!bVar26 * 2 | 0xfffffffc;
  uVar16 = (uVar4 + 1 + (uint)bVar26 * 2 & uVar25) * ((int)uVar11 + 1 + (uint)bVar26 * 2 & uVar25)
           >> bVar26 * '\x02' + 2;
  *local_38 = 0;
  uVar25 = uVar16 + iVar20;
  *local_40 = (ulong)uVar4;
  *pGVar18 = (ulong)uVar25 % uVar11;
  *pGVar17 = uVar25 / uVar11;
  iVar8 = uVar16 * 2;
  pGVar19 = pGVar18;
  if (uVar23 < 8) {
    uVar11 = (ulong)(uint)(iVar8 + iVar20);
    bVar26 = false;
    uVar15 = 0;
  }
  else {
    uVar23 = uVar23 >> 3;
    uVar11 = (ulong)(iVar8 + -1 + iVar20 + uVar23) / (ulong)uVar23;
    bVar26 = false;
    uVar15 = 0;
  }
LAB_001b3752:
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = uVar11;
  uVar9 = (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes;
  if (uVar9 == 3) {
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xb] = uVar15;
LAB_001b3783:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[10] = uVar15;
  }
  else if (uVar9 == 2) goto LAB_001b3783;
  GVar5 = pTexInfo->TileMode;
  if (pGVar10->TileInfo[GVar5].LogicalSize != 0 || ((ulong)aVar21 & 0x20000000000) != 0) {
    uVar24 = (ulong)pGVar10->TileInfo[GVar5].LogicalTileWidth;
    uVar14 = (ulong)pGVar10->TileInfo[GVar5].LogicalTileHeight;
    if ((((ulong)aVar21 & 2) != 0 && 0x10 < (int)(pGVar10->Platform).eRenderCoreFamily) &&
       (pCVar6 = (this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
                 pGmmLibContext, ((pCVar6->SkuTable).field_1.field_0x3 & 2) == 0)) {
      uVar22 = *(ulong *)&(pCVar6->WaTable).field_0x4;
      if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1040) == 0) {
        bVar12 = ((uVar22 >> 0x2f & 1) == 0) << 2 | 2;
        if ((uVar22 >> 0x2e & 1) != 0) {
          bVar12 = 0;
        }
      }
      else {
        bVar12 = ((uVar22 & 0xc00000000000) == 0) << 2;
      }
      uVar14 = uVar14 << bVar12;
    }
    lVar2 = uVar24 - 1;
    uVar24 = -uVar24;
    *pGVar19 = *pGVar19 + lVar2 & uVar24;
    lVar1 = uVar14 - 1;
    uVar14 = -uVar14;
    uVar22 = *pGVar17 + lVar1 & uVar14;
    *pGVar17 = uVar22;
    *local_38 = lVar2 + *local_38 & uVar24;
    if (bVar26) {
      uVar24 = *local_40 + lVar1 & uVar14;
    }
    else {
      uVar24 = (uVar15 + lVar1 & uVar14) + (lVar1 + uVar11 & uVar14);
    }
    *local_40 = uVar24;
    if ((~(ulong)(pTexInfo->Flags).Gpu & 0x22000000000) == 0) {
      uVar22 = uVar22 + (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5];
      *pGVar17 = uVar22;
      *local_40 = uVar22;
    }
    if (((((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
          pGmmLibContext)->SkuTable).field_1.field_0x3 & 0x10) != 0) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xd] = uVar11 + lVar1 & uVar14;
      uVar9 = (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes;
      if (uVar9 == 3) {
        uVar14 = lVar1 + uVar15 & uVar14;
        (pTexInfo->OffsetInfo).field_0.Texture2DOffsetInfo.Offset[0xe] = uVar14;
      }
      else {
        if (uVar9 != 2) goto LAB_001b38e6;
        uVar14 = lVar1 + uVar15 & uVar14;
      }
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xe] = uVar14;
    }
  }
LAB_001b38e6:
  if (((~(ulong)(pTexInfo->Flags).Gpu & 0x2000010000) == 0) &&
     (((pTexInfo->Flags).Info.field_0x4 & 0x10) != 0)) {
    pPVar7 = ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
             pGmmLibContext)->pPlatformInfo;
    uVar15 = (ulong)(pPVar7->Data).TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar11 = (ulong)(pPVar7->Data).TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    lVar1 = uVar15 - 1;
    uVar15 = -uVar15;
    *pGVar19 = *pGVar19 + lVar1 & uVar15;
    lVar2 = uVar11 - 1;
    uVar11 = -uVar11;
    *pGVar17 = *pGVar17 + lVar2 & uVar11;
    *local_38 = lVar1 + *local_38 & uVar15;
    *local_40 = lVar2 + *local_40 & uVar11;
  }
  return;
switchD_001b353b_caseD_155:
  uVar11 = 0;
  uVar15 = 0;
  goto LAB_001b3752;
}

Assistant:

void GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_GFX_SIZE_T *pUOffsetX, *pUOffsetY;
    GMM_GFX_SIZE_T *pVOffsetX, *pVOffsetY;
    uint32_t        YHeight = 0, VHeight = 0;
    bool            UVPacked = false;
    uint32_t        Height;
    uint32_t        WidthBytesPhysical = GFX_ULONG_CAST(pTexInfo->BaseWidth) * pTexInfo->BitsPerPixel >> 3;

#define SWAP_UV()              \
    {                          \
        GMM_GFX_SIZE_T *pTemp; \
                               \
        pTemp     = pUOffsetX; \
        pUOffsetX = pVOffsetX; \
        pVOffsetX = pTemp;     \
                               \
        pTemp     = pUOffsetY; \
        pUOffsetY = pVOffsetY; \
        pVOffsetY = pTemp;     \
    }

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);
    __GMM_ASSERTPTR(((pTexInfo->TileMode < GMM_TILE_MODES) && (pTexInfo->TileMode >= TILE_NONE)), VOIDRETURN);
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // GMM_PLANE_Y always at (0, 0)...
    pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;

    Height = pTexInfo->BaseHeight;
    if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        Height = __GMM_EXPAND_HEIGHT(this, Height, pTexInfo->Alignment.VAlign, pTexInfo);
        Height = ScaleTextureHeight(pTexInfo, Height);
        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface)
        {
            pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;
        }
    }

    // GMM_PLANE_U/V Planes...
    pUOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_U];
    pUOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U];
    pVOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_V];
    pVOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V];

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1:
            SWAP_UV(); // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420:  // Same as IMC3.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUUUUUU
                                          // UUUUUUUU
                                          // VVVVVVVV
                                          // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //UUUUUUUU
                                               //VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411:  // Similar to IMC3 but U/V are quarter width and full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UU
                                          // UU
                                          // UU
                                          // UU
                                          // VV
                                          // VV
                                          // VV
                                          // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;

                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                *pUOffsetX = 0;
                YHeight    = pTexInfo->BaseHeight;
                *pUOffsetY = pTexInfo->BaseHeight;

                *pVOffsetX = 0;
                VHeight    = pTexInfo->BaseHeight;
                *pVOffsetY = (GMM_GFX_SIZE_T)pTexInfo->BaseHeight * 2;
            }
            else //Tiled
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = (GMM_GFX_SIZE_T)GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;
            }
            break;
        }
        case GMM_FORMAT_IMC2:
            SWAP_UV(); // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            __GMM_ASSERT((pTexInfo->Pitch & 1) == 0);

            *pUOffsetX = 0;
            YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            *pVOffsetX = pTexInfo->Pitch / 2;
            VHeight    = GFX_CEIL_DIV(YHeight, 2);
            *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            // Not technically UV packed but sizing works out the same
            UVPacked = true;

            break;
        }
        case GMM_FORMAT_I420: // I420 = IYUV
        case GMM_FORMAT_IYUV:
            SWAP_UV(); // I420/IYUV = YV12 with Swapped U/V
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, YVSizeRShift, VSize, UOffset;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = GFX_ULONG_CAST(pTexInfo->Pitch) * pTexInfo->BaseHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(GFX_ULONG_CAST(pTexInfo->Pitch), YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(pTexInfo->BaseHeight, YSizeForUVPurposesDimensionalAlignment);

            VSize   = (YSizeForUVPurposes >> YVSizeRShift);
            UOffset = YSize + VSize;

            *pVOffsetX = 0;
            *pVOffsetY = pTexInfo->BaseHeight;

            *pUOffsetX = UOffset % pTexInfo->Pitch;
            *pUOffsetY = UOffset / pTexInfo->Pitch;

            YHeight = GFX_CEIL_DIV(YSize + 2 * VSize, WidthBytesPhysical);

            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]
            *pUOffsetX = *pVOffsetX = 0;
            YHeight                 = GFX_ALIGN(Height, __GMM_EVEN_ROW);
            *pUOffsetY = *pVOffsetY = YHeight;

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(Height, 2);
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
            }

            UVPacked = true;
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unknown Video Format U\n");
            break;
        }
    }

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = YHeight;
    if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] = VHeight;
    }
    else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] =
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_V] = VHeight;
    }

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) || pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        GMM_GFX_SIZE_T TileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
        GMM_GFX_SIZE_T PhysicalTileHeight = TileHeight;
        if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) > IGFX_GEN11LP_CORE)
        {
            if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS)
            {
                //U/V must be aligned to AuxT granularity, 4x pitchalign enforces 16K-align for 4KB tile,
                //add extra padding for 64K AuxT, 1MB AuxT
                if(GMM_IS_64KB_TILE(pTexInfo->Flags))
                {
                    TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
                }
                else
                {
                    PhysicalTileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 1); //  for 1 MB AuxT granularity, we do 1 MB alignment only in VA space and not in physical space, so do not multiply PhysicalTileHeight with 64 here
                    TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64);        // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
                }
            }
        }

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = UVPacked ?
                     GFX_ALIGN(*pVOffsetY, TileHeight) :
                     GFX_ALIGN(YHeight, TileHeight) + GFX_ALIGN(VHeight, TileHeight);

        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            *pUOffsetY += pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y];
            *pVOffsetY = *pUOffsetY;
        }

        // This is needed for FtrDisplayPageTables
        if(pGmmLibContext->GetSkuTable().FtrDisplayPageTables)
        {
            pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_Y] = GFX_ALIGN(YHeight, TileHeight);
            if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] = GFX_ALIGN(VHeight, TileHeight);
            }
            else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] =
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_V] = GFX_ALIGN(VHeight, TileHeight);
            }
        }
    }

    //Special case LKF MMC compressed surfaces
    if(pTexInfo->Flags.Gpu.MMC &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       pTexInfo->Flags.Info.TiledY)
    {
        GMM_GFX_SIZE_T TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = GFX_ALIGN(*pVOffsetY, TileHeight);
    }

    GMM_DPF_EXIT;

#undef SWAP_UV
}